

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_declblock_panel(void)

{
  int minw;
  int minh;
  int maxw;
  int maxh;
  Fl_Window *this;
  Fl_Group *pFVar1;
  Fl_Widget *pFVar2;
  Fl_Group *pFVar3;
  Fl_Window *this_00;
  Fl_Button *this_01;
  Fl_Box *o_4;
  Fl_Group *o_3;
  Fl_Box *o_2;
  Fl_Group *o_1;
  Fl_Double_Window *o;
  
  this = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window
            ((Fl_Double_Window *)this,300,0x87,"Declaration Block Properties");
  declblock_panel = (Fl_Double_Window *)this;
  Fl_Widget::labelsize((Fl_Widget *)this,0xb);
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,10,0x118,0x14,(char *)0x0);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,10,10,0x8c,0x14,(char *)0x0);
  declblock_public_choice = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Change widget accessibility.");
  Fl_Menu_::down_box(&declblock_public_choice->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::labelsize((Fl_Widget *)declblock_public_choice,0xb);
  Fl_Menu_::textsize(&declblock_public_choice->super_Fl_Menu_,0xb);
  Fl_Widget::when((Fl_Widget *)declblock_public_choice,'\0');
  Fl_Menu_::menu(&declblock_public_choice->super_Fl_Menu_,menu_declblock_public_choice);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar2,10,10,0x3c,0x14,"public");
  declblock_public_button_x = (Fl_Light_Button *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Make the declaration publicly accessible.");
  Fl_Widget::labelsize((Fl_Widget *)declblock_public_button_x,0xb);
  Fl_Widget::when((Fl_Widget *)declblock_public_button_x,'\0');
  (*(declblock_public_button_x->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,0x9b,10,0x87,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar2);
  Fl_Group::end(pFVar1);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,10,0x28,0x118,0x14,(char *)0x0);
  decl_before_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"#ifdef or similar conditional declaration block.");
  Fl_Widget::labelsize((Fl_Widget *)decl_before_input,0xb);
  Fl_Input_::textfont(&decl_before_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&decl_before_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)decl_before_input,5);
  Fl_Widget::when((Fl_Widget *)decl_before_input,'\0');
  pFVar1 = Fl_Group::current();
  Fl_Group::resizable(pFVar1,(Fl_Widget *)decl_before_input);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,10,0x4b,0x118,0x14,
                     "\"\\n...child code...\\n\" is inserted here");
  decl_after_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"#endif or similar declaration code block.");
  Fl_Widget::labelsize((Fl_Widget *)decl_after_input,0xb);
  Fl_Input_::textfont(&decl_after_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&decl_after_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)decl_after_input,5);
  Fl_Widget::when((Fl_Widget *)decl_after_input,'\0');
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,0x69,0x118,0x14,(char *)0x0);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar2,0xa0,0x69,0x3c,0x14,"OK");
  declblock_panel_ok = (Fl_Return_Button *)pFVar2;
  Fl_Widget::labelsize(pFVar2,0xb);
  this_00 = Fl_Widget::window((Fl_Widget *)declblock_panel_ok);
  Fl_Window::hotspot(this_00,(Fl_Widget *)declblock_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0xe6,0x69,0x3c,0x14,"Cancel");
  declblock_panel_cancel = this_01;
  Fl_Button::shortcut(this_01,0xff1b);
  Fl_Widget::labelsize(&declblock_panel_cancel->super_Fl_Widget,0xb);
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,10,0x69,0x8c,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar2);
  Fl_Group::end(pFVar1);
  minw = Fl_Widget::w((Fl_Widget *)this);
  minh = Fl_Widget::h((Fl_Widget *)this);
  maxw = Fl::w();
  maxh = Fl_Widget::h((Fl_Widget *)this);
  Fl_Window::size_range(this,minw,minh,maxw,maxh,0,0,0);
  Fl_Window::set_modal(&declblock_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)declblock_panel);
  return declblock_panel;
}

Assistant:

Fl_Double_Window* make_declblock_panel() {
  { Fl_Double_Window* o = declblock_panel = new Fl_Double_Window(300, 135, "Declaration Block Properties");
    declblock_panel->labelsize(11);
    { Fl_Group* o = new Fl_Group(10, 10, 280, 20);
      { declblock_public_choice = new Fl_Choice(10, 10, 140, 20);
        declblock_public_choice->tooltip("Change widget accessibility.");
        declblock_public_choice->down_box(FL_BORDER_BOX);
        declblock_public_choice->labelsize(11);
        declblock_public_choice->textsize(11);
        declblock_public_choice->when(FL_WHEN_NEVER);
        declblock_public_choice->menu(menu_declblock_public_choice);
      } // Fl_Choice* declblock_public_choice
      { declblock_public_button_x = new Fl_Light_Button(10, 10, 60, 20, "public");
        declblock_public_button_x->tooltip("Make the declaration publicly accessible.");
        declblock_public_button_x->labelsize(11);
        declblock_public_button_x->when(FL_WHEN_NEVER);
        declblock_public_button_x->hide();
      } // Fl_Light_Button* declblock_public_button_x
      { Fl_Box* o = new Fl_Box(155, 10, 135, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { decl_before_input = new Fl_Input(10, 40, 280, 20);
      decl_before_input->tooltip("#ifdef or similar conditional declaration block.");
      decl_before_input->labelsize(11);
      decl_before_input->textfont(4);
      decl_before_input->textsize(11);
      decl_before_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      decl_before_input->when(FL_WHEN_NEVER);
      Fl_Group::current()->resizable(decl_before_input);
    } // Fl_Input* decl_before_input
    { decl_after_input = new Fl_Input(10, 75, 280, 20, "\"\\n...child code...\\n\" is inserted here");
      decl_after_input->tooltip("#endif or similar declaration code block.");
      decl_after_input->labelsize(11);
      decl_after_input->textfont(4);
      decl_after_input->textsize(11);
      decl_after_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      decl_after_input->when(FL_WHEN_NEVER);
    } // Fl_Input* decl_after_input
    { Fl_Group* o = new Fl_Group(10, 105, 280, 20);
      { declblock_panel_ok = new Fl_Return_Button(160, 105, 60, 20, "OK");
        declblock_panel_ok->labelsize(11);
        declblock_panel_ok->window()->hotspot(declblock_panel_ok);
      } // Fl_Return_Button* declblock_panel_ok
      { declblock_panel_cancel = new Fl_Button(230, 105, 60, 20, "Cancel");
        declblock_panel_cancel->shortcut(0xff1b);
        declblock_panel_cancel->labelsize(11);
      } // Fl_Button* declblock_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 105, 140, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(o->w(), o->h(), Fl::w(), o->h());
    declblock_panel->set_modal();
    declblock_panel->end();
  } // Fl_Double_Window* declblock_panel
  return declblock_panel;
}